

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O0

void QCache<QString,_QRegularExpression>::Node::createInPlace
               (Node *n,QString *k,QRegularExpression *o,qsizetype cost)

{
  Node *in_RCX;
  QRegularExpression *in_RDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffffa0;
  Value *this;
  QString *k_00;
  Value local_30;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  k_00 = &local_20;
  QString::QString(in_stack_ffffffffffffffa0,in_RDI);
  this = &local_30;
  Value::Value(this,in_RDX,(qsizetype)in_RCX);
  Node(in_RCX,k_00,this);
  Value::~Value(this);
  QString::~QString((QString *)0x121517);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void createInPlace(Node *n, const Key &k, T *o, qsizetype cost)
        {
            new (n) Node{ Key(k), Value(o, cost) };
        }